

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::~Array
          (Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this)

{
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }